

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.h
# Opt level: O0

void __thiscall bloaty::RollupOutput::AddDataSourceName(RollupOutput *this,string_view name)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffb0;
  allocator<char> local_39;
  string local_38 [8];
  allocator<char> *in_stack_ffffffffffffffd0;
  undefined8 in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  
  __args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_39;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (in_stack_ffffffffffffffe0,
             (basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffffd8,
             in_stack_ffffffffffffffd0);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>(in_stack_ffffffffffffffb0,__args);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  return;
}

Assistant:

void AddDataSourceName(std::string_view name) {
    source_names_.emplace_back(std::string(name));
  }